

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_event_list.c
# Opt level: O1

int EventListClear(EventListHandle handle)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  
  lVar1 = (long)handle + 0x60;
  uni_mutex_lock(lVar1);
  plVar3 = *handle;
  if (plVar3 != (long *)0x0 && plVar3 != (long *)handle) {
    do {
      plVar2 = (long *)plVar3[1];
      *plVar2 = *plVar3;
      *(long **)(*plVar3 + 8) = plVar2;
      plVar3[1] = (long)plVar3;
      *plVar3 = (long)plVar3;
      *(int *)((long)handle + 0x30) = *(int *)((long)handle + 0x30) + -1;
      uni_mutex_unlock(lVar1);
      free(plVar3);
      uni_mutex_lock(lVar1);
      plVar3 = *handle;
      if (plVar3 == (long *)handle) break;
    } while (plVar3 != (long *)0x0);
  }
  uni_mutex_unlock(lVar1);
  uni_mutex_lock(lVar1);
  plVar3 = *(long **)((long)handle + 0x10);
  if (plVar3 != (long *)0x0 && plVar3 != (long *)((long)handle + 0x10)) {
    do {
      plVar2 = (long *)plVar3[1];
      *plVar2 = *plVar3;
      *(long **)(*plVar3 + 8) = plVar2;
      plVar3[1] = (long)plVar3;
      *plVar3 = (long)plVar3;
      *(int *)((long)handle + 0x34) = *(int *)((long)handle + 0x34) + -1;
      uni_mutex_unlock(lVar1);
      free(plVar3);
      uni_mutex_lock(lVar1);
      plVar3 = *(long **)((long)handle + 0x10);
      if (plVar3 == (long *)((long)handle + 0x10)) break;
    } while (plVar3 != (long *)0x0);
  }
  uni_mutex_unlock(lVar1);
  uni_mutex_lock(lVar1);
  plVar3 = *(long **)((long)handle + 0x20);
  if (plVar3 != (long *)0x0 && plVar3 != (long *)((long)handle + 0x20)) {
    do {
      plVar2 = (long *)plVar3[1];
      *plVar2 = *plVar3;
      *(long **)(*plVar3 + 8) = plVar2;
      plVar3[1] = (long)plVar3;
      *plVar3 = (long)plVar3;
      *(int *)((long)handle + 0x38) = *(int *)((long)handle + 0x38) + -1;
      uni_mutex_unlock(lVar1);
      free(plVar3);
      uni_mutex_lock(lVar1);
      plVar3 = *(long **)((long)handle + 0x20);
      if (plVar3 == (long *)((long)handle + 0x20)) break;
    } while (plVar3 != (long *)0x0);
  }
  uni_mutex_unlock(lVar1);
  return 0;
}

Assistant:

int EventListClear(EventListHandle handle) {
  EventList *event_list = (EventList *)handle;
  _consume_highest_list(&event_list->highest_list, NULL, NULL, NULL,
                        &event_list->mutex, &event_list->highest_cnt,
                        &event_list->is_running);
  _consume_medium_list(&event_list->medium_list, NULL, NULL, NULL,
                       &event_list->mutex, &event_list->medium_cnt,
                       &event_list->is_running);
  _consume_lowest_list(&event_list->lowest_list, NULL, NULL, NULL,
                       &event_list->mutex, &event_list->lowest_cnt,
                       &event_list->is_running);
  return 0;
}